

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall fmt::v6::format_int::format_decimal(format_int *this,unsigned_long_long value)

{
  long lVar1;
  uint index;
  uint index_1;
  char *ptr;
  unsigned_long_long value_local;
  format_int *this_local;
  char *local_8;
  
  ptr = this->buffer_ + 0x15;
  value_local = value;
  while (99 < value_local) {
    lVar1 = (value_local % 100) * 2;
    value_local = value_local / 100;
    ptr[-1] = internal::basic_data<void>::digits[(int)lVar1 + 1];
    ptr[-2] = internal::basic_data<void>::digits[lVar1];
    ptr = ptr + -2;
  }
  if (value_local < 10) {
    local_8 = ptr + -1;
    ptr[-1] = (char)value_local + '0';
  }
  else {
    ptr[-1] = internal::basic_data<void>::digits[(int)(value_local << 1) + 1];
    local_8 = ptr + -2;
    ptr[-2] = internal::basic_data<void>::digits[value_local << 1 & 0xffffffff];
  }
  return local_8;
}

Assistant:

char* format_decimal(unsigned long long value) {
    char* ptr = buffer_ + (buffer_size - 1);  // Parens to workaround MSVC bug.
    while (value >= 100) {
      // Integer division is slow so do it for a group of two digits instead
      // of for every digit. The idea comes from the talk by Alexandrescu
      // "Three Optimization Tips for C++". See speed-test for a comparison.
      auto index = static_cast<unsigned>((value % 100) * 2);
      value /= 100;
      *--ptr = internal::data::digits[index + 1];
      *--ptr = internal::data::digits[index];
    }
    if (value < 10) {
      *--ptr = static_cast<char>('0' + value);
      return ptr;
    }
    auto index = static_cast<unsigned>(value * 2);
    *--ptr = internal::data::digits[index + 1];
    *--ptr = internal::data::digits[index];
    return ptr;
  }